

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O2

void Cba_ObjSetFinFon(Cba_Ntk_t *p,int i,int k,int x)

{
  int iVar1;
  char *__assertion;
  
  if (i < 1) {
    __assertion = "i>0";
  }
  else {
    iVar1 = Cba_ObjFinFon(p,i,k);
    if (iVar1 == 0) {
      iVar1 = Vec_IntEntry(&p->vObjFin0,i);
      Vec_IntWriteEntry(&p->vFinFon,k + iVar1,x);
      return;
    }
    __assertion = "Cba_ObjFinFon(p, i, k)== 0";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                ,0x101,"void Cba_ObjSetFinFon(Cba_Ntk_t *, int, int, int)");
}

Assistant:

static inline void           Cba_ObjSetFinFon( Cba_Ntk_t * p, int i, int k, int x ) { assert(i>0); assert(Cba_ObjFinFon(p, i, k)== 0); Vec_IntWriteEntry(&p->vFinFon, Cba_ObjFin(p, i, k), x); }